

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Resize
          (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,map_index_t new_num_buckets)

{
  uint n;
  NodeBase *pNVar1;
  type_conflict tVar2;
  map_index_t b;
  char *pcVar3;
  LogMessage *pLVar4;
  NodeBase **ppNVar5;
  NodeBase **ppNVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  ViewType k;
  KeyNode *next;
  KeyNode *node;
  map_index_t i;
  map_index_t start;
  map_index_t old_table_size;
  NodeBase **old_table;
  Voidify local_71;
  uint local_70;
  uint local_6c;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_58;
  Voidify local_41;
  LogMessage local_40;
  Voidify local_29;
  uint local_28;
  uint local_24;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pKStack_10;
  map_index_t new_num_buckets_local;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  absl_log_internal_check_op_result._4_4_ = new_num_buckets;
  pKStack_10 = this;
  local_24 = absl::lts_20250127::log_internal::GetReferenceableValue(new_num_buckets);
  local_28 = absl::lts_20250127::log_internal::GetReferenceableValue(2);
  local_20 = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_int,unsigned_int>
                       (&local_24,&local_28,"new_num_buckets >= kMinTableSize");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x388,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  tVar2 = absl::lts_20250127::has_single_bit<unsigned_int>(absl_log_internal_check_op_result._4_4_);
  absl_log_internal_check_op_result_1._7_1_ = 0;
  if (((tVar2 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x389,"absl::has_single_bit(new_num_buckets)");
    absl_log_internal_check_op_result_1._7_1_ = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
  }
  if ((absl_log_internal_check_op_result_1._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  if ((this->super_UntypedMapBase).num_buckets_ == 1) {
    (this->super_UntypedMapBase).index_of_first_non_null_ = absl_log_internal_check_op_result._4_4_;
    (this->super_UntypedMapBase).num_buckets_ = absl_log_internal_check_op_result._4_4_;
    ppNVar5 = UntypedMapBase::CreateEmptyTable
                        (&this->super_UntypedMapBase,(this->super_UntypedMapBase).num_buckets_);
    (this->super_UntypedMapBase).table_ = ppNVar5;
  }
  else {
    local_6c = absl::lts_20250127::log_internal::GetReferenceableValue
                         (absl_log_internal_check_op_result._4_4_);
    local_70 = absl::lts_20250127::log_internal::GetReferenceableValue(2);
    local_68 = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_int,unsigned_int>
                         (&local_6c,&local_70,"new_num_buckets >= kMinTableSize");
    if (local_68 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_68);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&old_table,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x392,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                         ((LogMessage *)&old_table);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&old_table);
    }
    ppNVar5 = (this->super_UntypedMapBase).table_;
    n = (this->super_UntypedMapBase).num_buckets_;
    (this->super_UntypedMapBase).num_buckets_ = absl_log_internal_check_op_result._4_4_;
    ppNVar6 = UntypedMapBase::CreateEmptyTable
                        (&this->super_UntypedMapBase,(this->super_UntypedMapBase).num_buckets_);
    (this->super_UntypedMapBase).table_ = ppNVar6;
    node._4_4_ = (this->super_UntypedMapBase).index_of_first_non_null_;
    (this->super_UntypedMapBase).index_of_first_non_null_ =
         (this->super_UntypedMapBase).num_buckets_;
    for (; node._4_4_ < n; node._4_4_ = node._4_4_ + 1) {
      next = (KeyNode *)ppNVar5[node._4_4_];
      while (next != (KeyNode *)0x0) {
        pNVar1 = (next->super_NodeBase).next;
        v = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::key(next);
        k = TransparentSupport<std::__cxx11::string>::ToView<std::__cxx11::string>(v);
        b = BucketNumber(this,k);
        InsertUnique(this,b,next);
        next = (KeyNode *)pNVar1;
      }
    }
    UntypedMapBase::DeleteTable(&this->super_UntypedMapBase,ppNVar5,n);
    AssertLoadFactor(this);
  }
  return;
}

Assistant:

void Resize(map_index_t new_num_buckets) {
    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    ABSL_DCHECK(absl::has_single_bit(new_num_buckets));
    if (num_buckets_ == kGlobalEmptyTableSize) {
      // This is the global empty array.
      // Just overwrite with a new one. No need to transfer or free anything.
      num_buckets_ = index_of_first_non_null_ = new_num_buckets;
      table_ = CreateEmptyTable(num_buckets_);
      return;
    }

    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    const auto old_table = table_;
    const map_index_t old_table_size = num_buckets_;
    num_buckets_ = new_num_buckets;
    table_ = CreateEmptyTable(num_buckets_);
    const map_index_t start = index_of_first_non_null_;
    index_of_first_non_null_ = num_buckets_;
    for (map_index_t i = start; i < old_table_size; ++i) {
      for (KeyNode* node = static_cast<KeyNode*>(old_table[i]);
           node != nullptr;) {
        auto* next = static_cast<KeyNode*>(node->next);
        InsertUnique(BucketNumber(TS::ToView(node->key())), node);
        node = next;
      }
    }
    DeleteTable(old_table, old_table_size);
    AssertLoadFactor();
  }